

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O1

void spawn_helper(uv_pipe_t *channel,uv_process_t *process,char *helper)

{
  int iVar1;
  uv_loop_t *puVar2;
  int extraout_EDX;
  undefined8 *extraout_RDX;
  uv_pipe_t *size;
  code *read_cb;
  long lVar3;
  char *pcVar4;
  size_t exepath_size;
  char *args [3];
  uv_stdio_container_t stdio [3];
  uv_process_options_t options;
  char exepath [1024];
  uv_process_t uStack_580;
  uv_loop_t *puStack_4f8;
  uv_pipe_t *puStack_4f0;
  code *pcStack_4e8;
  uv_process_t *puStack_4e0;
  uv_pipe_t *puStack_4d8;
  undefined1 local_4c0 [24];
  uv_close_cb local_4a8;
  undefined1 local_498 [40];
  undefined4 local_470;
  undefined1 local_468 [48];
  uv_stdio_container_t *local_438;
  void *pvStack_430;
  uv_loop_t local_428;
  
  puVar2 = uv_default_loop();
  size = channel;
  iVar1 = uv_pipe_init(puVar2,channel,1);
  if (iVar1 == 0) {
    if (channel->ipc == 0) goto LAB_0015fd0f;
    size = (uv_pipe_t *)local_4c0;
    local_4c0._0_8_ = (void *)0x400;
    puVar2 = &local_428;
    iVar1 = uv_exepath((char *)&local_428,(size_t *)size);
    if (iVar1 != 0) goto LAB_0015fd14;
    *(undefined1 *)(local_4c0._0_8_ + (long)(local_428.handle_queue + -2)) = 0;
    local_468._16_8_ = local_4c0 + 8;
    local_4a8 = (uv_close_cb)0x0;
    local_468._24_8_ = (char **)0x0;
    pvStack_430 = (void *)0x0;
    local_468._32_8_ = (uv_connect_t *)0x0;
    local_468._0_8_ = exit_cb;
    local_438 = (uv_stdio_container_t *)local_498;
    local_468._40_8_ = (uv_shutdown_t *)0x300000000;
    local_498._0_4_ = UV_WRITABLE_PIPE|UV_READABLE_PIPE|UV_CREATE_PIPE;
    local_498._16_4_ = 2;
    local_498._24_4_ = 1;
    local_498._32_4_ = 2;
    local_470 = 2;
    local_4c0._8_8_ = &local_428;
    local_4c0._16_8_ = helper;
    local_498._8_8_ = channel;
    local_468._8_8_ = &local_428;
    puVar2 = uv_default_loop();
    size = (uv_pipe_t *)process;
    iVar1 = uv_spawn(puVar2,process,(uv_process_options_t *)local_468);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    spawn_helper_cold_1();
LAB_0015fd0f:
    spawn_helper_cold_4();
LAB_0015fd14:
    spawn_helper_cold_2();
  }
  spawn_helper_cold_3();
  pcStack_4e8 = (code *)0x15fd36;
  puStack_4e0 = process;
  puStack_4d8 = channel;
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if (size == (uv_pipe_t *)0x0) {
    if (extraout_EDX == 0) {
      uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
      return;
    }
  }
  else {
    pcStack_4e8 = (code *)0x15fd58;
    exit_cb_cold_1();
  }
  pcStack_4e8 = run_test_ipc_listen_before_write;
  exit_cb_cold_2();
  pcVar4 = "ipc_helper_listen_before_write";
  read_cb = on_read;
  puStack_4f0 = (uv_pipe_t *)0x15fd71;
  run_ipc_test("ipc_helper_listen_before_write",on_read);
  if (local_conn_accepted == '\0') {
    puStack_4f0 = (uv_pipe_t *)0x15fd9e;
    run_test_ipc_listen_before_write_cold_1();
LAB_0015fd9e:
    puStack_4f0 = (uv_pipe_t *)0x15fda3;
    run_test_ipc_listen_before_write_cold_2();
  }
  else {
    if (remote_conn_accepted == '\0') goto LAB_0015fd9e;
    if (read_cb_called == 1) {
      if (exit_cb_called == 1) {
        return;
      }
      goto LAB_0015fda8;
    }
  }
  puStack_4f0 = (uv_pipe_t *)0x15fda8;
  run_test_ipc_listen_before_write_cold_3();
LAB_0015fda8:
  puStack_4f0 = (uv_pipe_t *)run_ipc_test;
  run_test_ipc_listen_before_write_cold_4();
  puStack_4f8 = puVar2;
  puStack_4f0 = size;
  spawn_helper(&::channel,&uStack_580,pcVar4);
  uv_read_start((uv_stream_t *)&::channel,on_alloc,read_cb);
  puVar2 = uv_default_loop();
  lVar3 = 0;
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 == 0) {
    puVar2 = uv_default_loop();
    uv_walk(puVar2,close_walk_cb,(void *)0x0);
    lVar3 = 0;
    uv_run(puVar2,UV_RUN_DEFAULT);
    puVar2 = uv_default_loop();
    iVar1 = uv_loop_close(puVar2);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    run_ipc_test_cold_1();
  }
  run_ipc_test_cold_2();
  if (lVar3 != 0) {
    if (lVar3 < 0) {
      if (lVar3 != -0xfff) {
        pcVar4 = uv_strerror((int)lVar3);
        printf("error recving on channel: %s\n",pcVar4);
        abort();
      }
    }
    else {
      on_read_cold_1();
    }
  }
  free((void *)*extraout_RDX);
  return;
}

Assistant:

void spawn_helper(uv_pipe_t* channel,
                  uv_process_t* process,
                  const char* helper) {
  uv_process_options_t options;
  size_t exepath_size;
  char exepath[1024];
  char* args[3];
  int r;
  uv_stdio_container_t stdio[3];

  r = uv_pipe_init(uv_default_loop(), channel, 1);
  ASSERT(r == 0);
  ASSERT(channel->ipc);

  exepath_size = sizeof(exepath);
  r = uv_exepath(exepath, &exepath_size);
  ASSERT(r == 0);

  exepath[exepath_size] = '\0';
  args[0] = exepath;
  args[1] = (char*)helper;
  args[2] = NULL;

  memset(&options, 0, sizeof(options));
  options.file = exepath;
  options.args = args;
  options.exit_cb = exit_cb;
  options.stdio = stdio;
  options.stdio_count = ARRAY_SIZE(stdio);

  stdio[0].flags = UV_CREATE_PIPE | UV_READABLE_PIPE | UV_WRITABLE_PIPE;
  stdio[0].data.stream = (uv_stream_t*) channel;
  stdio[1].flags = UV_INHERIT_FD;
  stdio[1].data.fd = 1;
  stdio[2].flags = UV_INHERIT_FD;
  stdio[2].data.fd = 2;

  r = uv_spawn(uv_default_loop(), process, &options);
  ASSERT(r == 0);
}